

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_node *
lys_node_dup(lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow)

{
  int iVar1;
  lys_node *plVar2;
  lys_node *node_00;
  lys_node *node_01;
  lys_node *plVar3;
  lys_node *plVar4;
  
  iVar1 = 0;
  if (shallow == 0) {
    iVar1 = 1;
    for (plVar2 = parent; plVar2 != (lys_node *)0x0; plVar2 = lys_parent(plVar2)) {
      if ((plVar2->nodetype & (LYS_ACTION|LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) !=
          LYS_UNKNOWN) {
        iVar1 = (uint)(plVar2->nodetype != LYS_GROUPING) * 2;
        break;
      }
    }
  }
  node_00 = lys_node_dup_recursion(module,parent,node,unres,shallow,iVar1);
  plVar2 = node_00;
  if (iVar1 == 0) {
    return node_00;
  }
  do {
    node_01 = plVar2;
    if (node_01 == (lys_node *)0x0) {
      return node_00;
    }
    iVar1 = lys_has_xpath(node_01);
    if ((iVar1 != 0) &&
       (iVar1 = unres_schema_add_node(module,unres,node_01,UNRES_XPATH,(lys_node *)0x0), iVar1 == -1
       )) {
      return (lys_node *)0x0;
    }
    if (((node_01->nodetype & 0x882c) == LYS_UNKNOWN) &&
       (plVar2 = node_01->child, plVar2 != (lys_node *)0x0)) goto LAB_0015b05f;
    if (node_01 == node_00) {
      return node_00;
    }
    do {
      plVar2 = node_01->next;
LAB_0015b05f:
      if (plVar2 != (lys_node *)0x0) break;
      node_01 = lys_parent(node_01);
      plVar3 = lys_parent(node_01);
      plVar4 = lys_parent(node_00);
    } while (plVar3 != plVar4);
  } while( true );
}

Assistant:

struct lys_node *
lys_node_dup(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
             struct unres_schema *unres, int shallow)
{
    struct lys_node *p = NULL;
    int finalize = 0;
    struct lys_node *result, *iter, *next;

    if (!shallow) {
        /* get know where in schema tree we are to know what should be done during instantiation of the grouping */
        for (p = parent;
             p && !(p->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC | LYS_ACTION | LYS_GROUPING));
             p = lys_parent(p));
        finalize = p ? ((p->nodetype == LYS_GROUPING) ? 0 : 2) : 1;
    }

    result = lys_node_dup_recursion(module, parent, node, unres, shallow, finalize);
    if (finalize) {
        /* check xpath expressions in the instantiated tree */
        for (iter = next = result; iter; iter = next) {
            if (lys_has_xpath(iter) && unres_schema_add_node(module, unres, iter, UNRES_XPATH, NULL) == -1) {
                /* invalid xpath */
                return NULL;
            }

            /* select next item */
            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA | LYS_GROUPING)) {
                /* child exception for leafs, leaflists and anyxml without children, ignore groupings */
                next = NULL;
            } else {
                next = iter->child;
            }
            if (!next) {
                /* no children, try siblings */
                if (iter == result) {
                    /* we are done, no next element to process */
                    break;
                }
                next = iter->next;
            }
            while (!next) {
                /* parent is already processed, go to its sibling */
                iter = lys_parent(iter);
                if (lys_parent(iter) == lys_parent(result)) {
                    /* we are done, no next element to process */
                    break;
                }
                next = iter->next;
            }
        }
    }

    return result;
}